

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handleRST_STREAM(QHttp2Connection *this)

{
  bool bVar1;
  quint32 qVar2;
  uint uVar3;
  quint32 qVar4;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  quint32 lastRelevantStreamID;
  uint error;
  QPointer<QHttp2Stream> stream_1;
  QPointer<QHttp2Stream> stream;
  quint32 streamID;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QHttp2Stream *this_00;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd0;
  char *message;
  undefined8 in_stack_ffffffffffffffd8;
  Http2Error HVar5;
  uint in_stack_ffffffffffffffe0;
  anon_class_16_2_9da49ed6 local_18;
  long local_8;
  
  HVar5 = (Http2Error)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  qVar2 = Http2::Frame::streamID((Frame *)0x2b7ea0);
  if (qVar2 == 0) {
    connectionError((QHttp2Connection *)(ulong)in_stack_ffffffffffffffe0,HVar5,
                    in_stack_ffffffffffffffd0);
  }
  else {
    Http2::Frame::dataBegin((Frame *)this_00);
    uVar3 = qFromBigEndian<unsigned_int>
                      ((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    message = (char *)0xaaaaaaaaaaaaaaaa;
    HVar5 = 0xaaaaaaaa;
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::operator[]
              (in_stack_ffffffffffffffc0,(uint *)this_00);
    QPointer<QHttp2Stream>::QPointer
              ((QPointer<QHttp2Stream> *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
               (QPointer<QHttp2Stream> *)in_RDI);
    bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttp2Stream> *)0x2b7f25);
    if (bVar1) {
      QPointer<QHttp2Stream>::operator->((QPointer<QHttp2Stream> *)0x2b7f35);
      QHttp2Stream::rstFrameRecived((QHttp2Stream *)0x2b7f41,(quint32)((ulong)in_RDI >> 0x20));
    }
    QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2b7f4b);
    local_18.streamID = qVar2;
    qVar4 = handleRST_STREAM::anon_class_16_2_9da49ed6::operator()(&local_18);
    if (qVar4 < qVar2) {
      connectionError((QHttp2Connection *)CONCAT44(qVar2,in_stack_ffffffffffffffe0),HVar5,message);
    }
    else {
      QHash<unsigned_int,_QPointer<QHttp2Stream>_>::operator[]
                ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)0xaaaaaaaaaaaaaaaa,(uint *)this_00)
      ;
      QPointer<QHttp2Stream>::QPointer
                ((QPointer<QHttp2Stream> *)CONCAT44(uVar3,qVar4),(QPointer<QHttp2Stream> *)in_RDI);
      bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttp2Stream> *)0x2b7fcf);
      if (bVar1) {
        QPointer<QHttp2Stream>::operator->((QPointer<QHttp2Stream> *)0x2b7fdf);
        QHttp2Stream::handleRST_STREAM(this_00,(Frame *)CONCAT44(uVar3,qVar4));
      }
      QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2b7ffc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::handleRST_STREAM()
{
    Q_ASSERT(inboundFrame.type() == FrameType::RST_STREAM);

    // RFC 9113, 6.4: RST_STREAM frames MUST be associated with a stream.
    // If a RST_STREAM frame is received with a stream identifier of 0x0,
    // the recipient MUST treat this as a connection error (Section 5.4.1)
    // of type PROTOCOL_ERROR.
    const auto streamID = inboundFrame.streamID();
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on 0x0");

    // RFC 9113, 6.4: A RST_STREAM frame with a length other than 4 octets MUST be treated as a
    // connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 4);

    const auto error = qFromBigEndian<quint32>(inboundFrame.dataBegin());
    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        emit stream->rstFrameRecived(error);

    // Verify that whatever stream is being RST'd is not in the idle state:
    const quint32 lastRelevantStreamID = [this, streamID]() {
        quint32 peerMask = m_connectionType == Type::Client ? 0 : 1;
        return ((streamID & 1) == peerMask) ? m_lastIncomingStreamID : m_nextStreamID - 2;
    }();
    if (streamID > lastRelevantStreamID) {
        // "RST_STREAM frames MUST NOT be sent for a stream
        // in the "idle" state. .. the recipient MUST treat this
        // as a connection error (Section 5.4.1) of type PROTOCOL_ERROR."
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on idle stream");
    }

    Q_ASSERT(inboundFrame.dataSize() == 4);

    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        stream->handleRST_STREAM(inboundFrame);
}